

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_filter.cpp
# Opt level: O2

string * __thiscall
duckdb::ExpressionFilter::ToString
          (string *__return_storage_ptr__,ExpressionFilter *this,string *column_name)

{
  type pBVar1;
  pointer pEVar2;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_28;
  long *local_20;
  
  local_28._M_head_impl = (Expression *)0x0;
  make_uniq<duckdb::BoundReferenceExpression,std::__cxx11::string_const&,duckdb::LogicalTypeId_const&,unsigned_long_long>
            ((duckdb *)&local_20,column_name,&LogicalType::INVALID,(unsigned_long_long *)&local_28);
  pBVar1 = unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
           ::operator*((unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
                        *)&local_20);
  (*(this->super_TableFilter)._vptr_TableFilter[6])(&local_28,this,pBVar1);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)&local_28);
  (*(pEVar2->super_BaseExpression)._vptr_BaseExpression[8])(__return_storage_ptr__,pEVar2);
  if (local_28._M_head_impl != (Expression *)0x0) {
    (*((local_28._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

string ExpressionFilter::ToString(const string &column_name) const {
	auto name_expr = make_uniq<BoundReferenceExpression>(column_name, LogicalType::INVALID, 0ULL);
	return ToExpression(*name_expr)->ToString();
}